

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_EBFabFactory.cpp
# Opt level: O0

void __thiscall amrex::EBFArrayBoxFactory::destroy(EBFArrayBoxFactory *this,FArrayBox *fab)

{
  long *in_RSI;
  long in_RDI;
  EBFArrayBox *p;
  
  if (*(int *)(in_RDI + 8) == 0) {
    if (in_RSI != (long *)0x0) {
      (**(code **)(*in_RSI + 8))();
    }
  }
  else if (in_RSI != (long *)0x0) {
    (**(code **)(*in_RSI + 8))();
  }
  return;
}

Assistant:

void
EBFArrayBoxFactory::destroy (FArrayBox* fab) const
{
    if (m_support == EBSupport::none)
    {
        delete fab;
    }
    else
    {
        EBFArrayBox* p = static_cast<EBFArrayBox*>(fab);
        delete p;
    }
}